

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

translation_t *
opengv::absolute_pose::p2p
          (translation_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,size_t index0,
          size_t index1)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  double *pdVar18;
  ActualDstType actualDst;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  rotation_t N;
  Vector3d temp2;
  Vector3d e1;
  Matrix3d Q;
  double local_228;
  double local_218 [6];
  double local_1e8 [3];
  double local_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  undefined1 local_1b0 [16];
  double local_1a0;
  undefined1 local_198 [16];
  double local_188;
  double *local_180;
  double *local_178;
  double *local_170;
  undefined8 local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  double dStack_e8;
  double adStack_e0 [3];
  double adStack_c8 [4];
  double local_a8;
  double dStack_a0;
  double dStack_98;
  double local_90;
  ulong uStack_88;
  double local_80;
  double local_78;
  double local_60;
  double local_48;
  double dStack_40;
  double dStack_38;
  undefined1 auVar30 [64];
  undefined1 extraout_var [56];
  
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_a8);
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_48,adapter,index1);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_48;
  local_118._8_8_ = 0;
  local_118._0_8_ = local_a8;
  local_128._8_8_ = dStack_98;
  local_128._0_8_ = dStack_a0;
  auVar19._8_8_ = dStack_38;
  auVar19._0_8_ = dStack_40;
  local_108._8_8_ = dStack_98;
  local_108._0_8_ = dStack_98;
  auVar20 = vunpcklpd_avx(local_108,local_118);
  auVar36._0_8_ = dStack_40 * auVar20._0_8_;
  auVar36._8_8_ = dStack_38 * auVar20._8_8_;
  auVar41._8_8_ = dStack_38;
  auVar41._0_8_ = dStack_38;
  auVar20 = vunpcklpd_avx(auVar41,auVar23);
  auVar29 = vfmsub213pd_fma(auVar20,local_128,auVar36);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_48 * dStack_a0;
  auVar19 = vfmsub231sd_fma(auVar24,local_118,auVar19);
  dVar22 = auVar19._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar22 * dVar22 + auVar29._0_8_ * auVar29._0_8_ + auVar29._8_8_ * auVar29._8_8_;
  auVar20 = vsqrtpd_avx(auVar32);
  dVar31 = auVar20._0_8_;
  auVar37._8_8_ = dVar31;
  auVar37._0_8_ = dVar31;
  auVar20 = vdivpd_avx(auVar29,auVar37);
  local_48 = auVar20._0_8_;
  dVar2 = local_48;
  dStack_40 = auVar20._8_8_;
  auVar25._0_8_ = dVar22 / dVar31;
  auVar25._8_8_ = auVar19._8_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_48;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dStack_40;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dStack_a0 * auVar25._0_8_;
  local_138 = vfmsub231sd_fma(auVar42,auVar38,local_108);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dStack_98 * local_48;
  local_158 = vfmsub231sd_fma(auVar43,auVar25,local_118);
  local_1d0 = dStack_40;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_a8 * dStack_40;
  local_148 = vfmsub231sd_fma(auVar26,auVar33,local_128);
  dStack_38 = auVar25._0_8_;
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_1c8,adapter,index1);
  (*adapter->_vptr_AbsoluteAdapterBase[6])(local_218,adapter,index0);
  auVar29._8_8_ = dStack_1c0;
  auVar29._0_8_ = local_1c8;
  auVar20._8_8_ = local_218[1];
  auVar20._0_8_ = local_218[0];
  auVar29 = vsubpd_avx(auVar29,auVar20);
  local_218[2] = local_1b8 - local_218[2];
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       local_218[2] * local_218[2] + auVar29._0_8_ * auVar29._0_8_ + auVar29._8_8_ * auVar29._8_8_;
  auVar20 = vsqrtpd_avx(auVar39);
  dVar22 = auVar20._0_8_;
  auVar44._8_8_ = dVar22;
  auVar44._0_8_ = dVar22;
  auVar29 = vdivpd_avx(auVar29,auVar44);
  auVar34._0_8_ = local_218[2] / dVar22;
  auVar34._8_8_ = 0;
  auVar47._8_8_ = 0x7fffffffffffffff;
  auVar47._0_8_ = 0x7fffffffffffffff;
  auVar20 = vandpd_avx(auVar29,auVar47);
  auVar19 = vshufps_avx(auVar20,auVar20,0x4e);
  dVar31 = auVar20._0_8_;
  dVar22 = auVar19._0_8_;
  auVar20 = vshufpd_avx(auVar29,auVar29,1);
  if ((dVar31 <= dVar22) || (auVar19 = vandpd_avx(auVar34,auVar47), dVar31 <= auVar19._0_8_)) {
    if ((dVar22 <= dVar31) ||
       (auVar11._8_8_ = 0x7fffffffffffffff, auVar11._0_8_ = 0x7fffffffffffffff,
       auVar19 = vandpd_avx512vl(auVar34,auVar11), dVar22 <= auVar19._0_8_)) {
      auVar13._8_8_ = 0x8000000000000000;
      auVar13._0_8_ = 0x8000000000000000;
      auVar19 = vxorpd_avx512vl(auVar29,auVar13);
      auVar49._0_8_ = auVar19._0_8_ / auVar34._0_8_;
      auVar49._8_8_ = auVar19._8_8_;
      auVar48 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar12._8_8_ = 0x8000000000000000;
      auVar12._0_8_ = 0x8000000000000000;
      auVar19 = vxorpd_avx512vl(auVar34,auVar12);
      auVar45._0_8_ = auVar19._0_8_ / auVar20._0_8_;
      auVar45._8_8_ = auVar19._8_8_;
      auVar48 = vunpcklpd_avx(ZEXT816(0) << 0x40,auVar45);
      auVar49 = ZEXT816(0x3ff0000000000000);
    }
  }
  else {
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar19 = vxorpd_avx512vl(auVar20,auVar5);
    auVar48._8_8_ = 0x3ff0000000000000;
    auVar48._0_8_ = auVar19._0_8_ / auVar29._0_8_;
    auVar49 = SUB6416(ZEXT864(0),0) << 0x40;
  }
  auVar24 = vunpcklpd_avx(local_118,local_138);
  auVar26 = vunpcklpd_avx(local_128,local_158);
  auVar32 = vunpcklpd_avx(local_108,local_148);
  dVar22 = auVar49._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar22 * dVar22 + auVar48._0_8_ * auVar48._0_8_ + auVar48._8_8_ * auVar48._8_8_;
  auVar19 = vsqrtpd_avx(auVar51);
  dVar31 = auVar19._0_8_;
  auVar53._8_8_ = dVar31;
  auVar53._0_8_ = dVar31;
  auVar19 = vdivpd_avx(auVar48,auVar53);
  auVar50._0_8_ = dVar22 / dVar31;
  auVar50._8_8_ = auVar49._8_8_;
  auVar23 = vshufpd_avx(auVar19,auVar19,1);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = auVar20._0_8_ * auVar50._0_8_;
  auVar33 = vfmsub231sd_fma(auVar54,auVar23,auVar34);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = auVar34._0_8_ * auVar19._0_8_;
  auVar36 = vfmsub231sd_fma(auVar55,auVar50,auVar29);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = auVar23._0_8_ * auVar29._0_8_;
  auVar20 = vfmsub231sd_fma(auVar52,auVar19,auVar20);
  local_218[0] = (double)vmovlpd_avx(auVar29);
  local_1e8[0] = auVar34._0_8_;
  local_218[1] = auVar33._0_8_;
  local_218[4] = auVar36._0_8_;
  local_1e8[1] = auVar20._0_8_;
  local_218[2] = auVar19._0_8_;
  local_218[3] = auVar29._8_8_;
  local_218[5] = (double)vmovhpd_avx(auVar19);
  local_1e8[2] = auVar50._0_8_;
  adStack_c8[2] =
       (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[8];
  _local_f8 = *(undefined1 (*) [64])
               (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array;
  lVar17 = 6;
  pdVar18 = &local_1b8;
  do {
    dVar22 = *(double *)(local_128 + lVar17 * 8);
    auVar35._0_8_ = auVar24._0_8_ * dVar22;
    auVar35._8_8_ = auVar24._8_8_ * dVar22;
    auVar6._8_8_ = *(undefined8 *)(local_118 + lVar17 * 8 + 8);
    auVar6._0_8_ = *(undefined8 *)(local_118 + lVar17 * 8 + 8);
    auVar20 = vfmadd231pd_avx512vl(auVar35,auVar26,auVar6);
    auVar7._8_8_ = *(undefined8 *)(local_f8 + lVar17 * 8);
    auVar7._0_8_ = *(undefined8 *)(local_f8 + lVar17 * 8);
    auVar20 = vfmadd231pd_avx512vl(auVar20,auVar32,auVar7);
    *(undefined1 (*) [16])(pdVar18 + -2) = auVar20;
    *pdVar18 = dVar22 * dVar2 +
               local_1d0 * *(double *)(local_118 + lVar17 * 8 + 8) +
               auVar25._0_8_ * *(double *)(local_f8 + lVar17 * 8);
    lVar17 = lVar17 + 1;
    pdVar18 = pdVar18 + 3;
  } while (lVar17 != 9);
  local_168 = 3;
  auVar15._8_8_ = dStack_1c0;
  auVar15._0_8_ = local_1c8;
  pdVar18 = &local_80;
  lVar17 = 0;
  do {
    auVar8._8_8_ = local_218[lVar17];
    auVar8._0_8_ = local_218[lVar17];
    auVar20 = vmulpd_avx512vl(auVar15,auVar8);
    auVar9._8_8_ = local_218[lVar17 + 3];
    auVar9._0_8_ = local_218[lVar17 + 3];
    auVar20 = vfmadd231pd_avx512vl(auVar20,local_1b0,auVar9);
    auVar10._8_8_ = local_218[lVar17 + 6];
    auVar10._0_8_ = local_218[lVar17 + 6];
    auVar20 = vfmadd231pd_avx512vl(auVar20,local_198,auVar10);
    *(undefined1 (*) [16])(pdVar18 + -2) = auVar20;
    *pdVar18 = local_1b8 * local_218[lVar17] +
               local_188 * local_218[lVar17 + 6] + local_1a0 * local_218[lVar17 + 3];
    lVar17 = lVar17 + 1;
    pdVar18 = pdVar18 + 3;
  } while (lVar17 != 3);
  local_180 = local_218;
  local_178 = &local_1c8;
  local_170 = local_218;
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_1c8,adapter,index1);
  (*adapter->_vptr_AbsoluteAdapterBase[6])(local_f8,adapter,index0);
  auVar16._8_8_ = dStack_1c0;
  auVar16._0_8_ = local_1c8;
  auVar20 = vsubpd_avx(auVar16,local_f8);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (local_1b8 - dStack_e8) * (local_1b8 - dStack_e8) +
       auVar20._0_8_ * auVar20._0_8_ + auVar20._8_8_ * auVar20._8_8_;
  auVar20 = vsqrtsd_avx(auVar27,auVar27);
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_1c8,adapter,index1);
  dVar2 = local_a8 * local_1c8 + dStack_a0 * dStack_1c0 + dStack_98 * local_1b8;
  dVar22 = 1.0 / (1.0 - dVar2 * dVar2) + -1.0;
  if (dVar22 < 0.0) {
    auVar30._0_8_ = sqrt(dVar22);
    auVar30._8_56_ = extraout_var;
    auVar29 = auVar30._0_16_;
  }
  else {
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar22;
    auVar29 = vsqrtsd_avx(auVar28,auVar28);
  }
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar2;
  uVar3 = vcmpsd_avx512f(auVar46,ZEXT816(0) << 0x40,1);
  bVar4 = (bool)((byte)uVar3 & 1);
  auVar21._0_8_ =
       (ulong)bVar4 * (auVar29._0_8_ ^ 0x8000000000000000) + (ulong)!bVar4 * auVar29._0_8_;
  auVar21._8_8_ = auVar29._8_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_90;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uStack_88;
  auVar29 = vfmsub132sd_fma(auVar21,auVar40,auVar1);
  local_228 = auVar20._0_8_;
  dVar2 = auVar29._0_8_ * -local_228;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = local_90 * dVar2;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = dVar2 * local_78;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar2 * local_60;
  (*adapter->_vptr_AbsoluteAdapterBase[6])(local_f8,adapter,index0);
  dVar22 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
           m_storage.m_data.array[0];
  dVar31 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
           m_storage.m_data.array[1];
  auVar14._8_8_ = local_218[3];
  auVar14._0_8_ = local_218[2];
  dVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2];
  auVar20 = vmovhpd_avx(auVar14,local_218[5]);
  dStack_e8 = dVar2 * local_1e8[2] + dVar22 * local_1e8[0] + dVar31 * local_1e8[1] + dStack_e8;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] =
       dVar22 * local_218[0] + dVar31 * local_218[1] + dVar2 * auVar20._0_8_ +
       (double)local_f8._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] =
       dVar22 * local_218[3] + dVar31 * local_218[4] + dVar2 * auVar20._8_8_ +
       (double)local_f8._8_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dStack_e8;
  if (((NAN((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0])) ||
      (NAN((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
           m_storage.m_data.array[1]))) || (NAN(dStack_e8))) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

opengv::translation_t
opengv::absolute_pose::p2p(
    const AbsoluteAdapterBase & adapter,
    size_t index0,
    size_t index1)
{
  Eigen::Vector3d e1 = adapter.getBearingVector(index0);
  Eigen::Vector3d e3 = adapter.getBearingVector(index1);
  e3 = e1.cross(e3);
  e3 = e3/e3.norm();
  Eigen::Vector3d e2 = e3.cross(e1);

  rotation_t T;
  T.row(0) = e1.transpose();
  T.row(1) = e2.transpose();
  T.row(2) = e3.transpose();

  Eigen::Vector3d n1 = adapter.getPoint(index1) - adapter.getPoint(index0);
  n1 = n1/n1.norm();
  Eigen::Vector3d n3;
  if( (fabs(n1[0]) > fabs(n1[1])) && (fabs(n1[0]) > fabs(n1[2])) )
  {
    n3[1] = 1.0;
    n3[2] = 0.0;
    n3[0] = -n1[1]/n1[0];
  }
  else
  {
    if( (fabs(n1[1]) > fabs(n1[0])) && (fabs(n1[1]) > fabs(n1[2])) )
    {
      n3[2] = 1.0;
      n3[0] = 0.0;
      n3[1] = -n1[2]/n1[1];
    }
    else
    {
      n3[0] = 1.0;
      n3[1] = 0.0;
      n3[2] = -n1[0]/n1[2];
    }
  }
  n3 = n3 / n3.norm();
  Eigen::Vector3d n2 = n3.cross(n1);

  rotation_t N;
  N.row(0) = n1.transpose();
  N.row(1) = n2.transpose();
  N.row(2) = n3.transpose();

  Eigen::Matrix3d Q = T * adapter.getR().transpose() * N.transpose();
  Eigen::Vector3d temp1 = adapter.getPoint(index1) - adapter.getPoint(index0);
  double d_12 = temp1.norm();

  Eigen::Vector3d temp2 = adapter.getBearingVector(index1);
  double cos_beta = e1.dot(temp2);
  double b = 1/( 1 - pow( cos_beta, 2 ) ) - 1;

  if( cos_beta < 0 )
    b = -sqrt(b);
  else
    b = sqrt(b);

  double temp3 = d_12 * ( Q(1,0) * b - Q(0,0) );

  translation_t solution = -temp3 * Q.row(0).transpose();
  solution = adapter.getPoint(index0) + N.transpose()*solution;

  if(
    solution(0,0) != solution(0,0) ||
    solution(1,0) != solution(1,0) ||
    solution(2,0) != solution(2,0) )
    solution = Eigen::Vector3d::Zero();

  return solution;
}